

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void integer_suite::test_minus_hundred(void)

{
  char input [5];
  decoder_type decoder;
  long local_178;
  undefined4 local_16c;
  value_type local_168 [8];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_168,"-100",5);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            (&local_160,(value_type (*) [5])local_168);
  local_178 = CONCAT44(local_178._4_4_,local_160.current.code);
  local_16c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1aa,"void integer_suite::test_minus_hundred()",&local_178,&local_16c);
  local_178 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_160);
  local_16c = 0xffffff9c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","-100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ab,"void integer_suite::test_minus_hundred()",&local_178,&local_16c);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178 = CONCAT44(local_178._4_4_,local_160.current.code);
  local_16c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ad,"void integer_suite::test_minus_hundred()",&local_178,&local_16c);
  return;
}

Assistant:

void test_minus_hundred()
{
    const char input[] = "-100";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<std::int64_t>(), -100);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}